

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_iterative.c
# Opt level: O0

int QRfact(int n,realtype **h,realtype *q,int job)

{
  double dVar1;
  double dVar2;
  int iVar3;
  double dVar4;
  double dVar5;
  double local_88;
  double local_80;
  double local_78;
  double local_70;
  int local_68;
  int code;
  int n_minus_1;
  int q_ptr;
  int k;
  int j;
  int i;
  realtype temp3;
  realtype temp2;
  realtype temp1;
  realtype s;
  realtype c;
  int job_local;
  realtype *q_local;
  realtype **h_local;
  int n_local;
  
  if (job == 0) {
    local_68 = 0;
    for (n_minus_1 = 0; n_minus_1 < n; n_minus_1 = n_minus_1 + 1) {
      for (q_ptr = 0; q_ptr < n_minus_1 + -1; q_ptr = q_ptr + 1) {
        dVar5 = h[q_ptr][n_minus_1];
        dVar1 = h[q_ptr + 1][n_minus_1];
        dVar4 = q[q_ptr * 2];
        dVar2 = q[q_ptr * 2 + 1];
        h[q_ptr][n_minus_1] = dVar4 * dVar5 + -(dVar2 * dVar1);
        h[q_ptr + 1][n_minus_1] = dVar2 * dVar5 + dVar4 * dVar1;
      }
      dVar5 = h[n_minus_1][n_minus_1];
      dVar1 = h[n_minus_1 + 1][n_minus_1];
      if ((dVar1 != 0.0) || (NAN(dVar1))) {
        if (ABS(dVar1) < ABS(dVar5)) {
          dVar4 = dVar1 / dVar5;
          if (0.0 < dVar4 * dVar4 + 1.0) {
            local_78 = sqrt(dVar4 * dVar4 + 1.0);
          }
          else {
            local_78 = 0.0;
          }
          s = 1.0 / local_78;
          temp1 = -s * dVar4;
        }
        else {
          dVar4 = dVar5 / dVar1;
          if (0.0 < dVar4 * dVar4 + 1.0) {
            local_70 = sqrt(dVar4 * dVar4 + 1.0);
          }
          else {
            local_70 = 0.0;
          }
          temp1 = -1.0 / local_70;
          s = -temp1 * dVar4;
        }
      }
      else {
        s = 1.0;
        temp1 = 0.0;
      }
      q[n_minus_1 * 2] = s;
      q[n_minus_1 * 2 + 1] = temp1;
      dVar5 = s * dVar5 + -(temp1 * dVar1);
      h[n_minus_1][n_minus_1] = dVar5;
      if ((dVar5 == 0.0) && (!NAN(dVar5))) {
        local_68 = n_minus_1 + 1;
      }
    }
  }
  else {
    iVar3 = n + -1;
    local_68 = 0;
    for (n_minus_1 = 0; n_minus_1 < iVar3; n_minus_1 = n_minus_1 + 1) {
      dVar5 = h[n_minus_1][iVar3];
      dVar1 = h[n_minus_1 + 1][iVar3];
      dVar4 = q[n_minus_1 * 2];
      dVar2 = q[n_minus_1 * 2 + 1];
      h[n_minus_1][iVar3] = dVar4 * dVar5 + -(dVar2 * dVar1);
      h[n_minus_1 + 1][iVar3] = dVar2 * dVar5 + dVar4 * dVar1;
    }
    dVar5 = h[iVar3][iVar3];
    dVar1 = h[n][iVar3];
    if ((dVar1 != 0.0) || (NAN(dVar1))) {
      if (ABS(dVar1) < ABS(dVar5)) {
        dVar4 = dVar1 / dVar5;
        if (0.0 < dVar4 * dVar4 + 1.0) {
          local_88 = sqrt(dVar4 * dVar4 + 1.0);
        }
        else {
          local_88 = 0.0;
        }
        s = 1.0 / local_88;
        temp1 = -s * dVar4;
      }
      else {
        dVar4 = dVar5 / dVar1;
        if (0.0 < dVar4 * dVar4 + 1.0) {
          local_80 = sqrt(dVar4 * dVar4 + 1.0);
        }
        else {
          local_80 = 0.0;
        }
        temp1 = -1.0 / local_80;
        s = -temp1 * dVar4;
      }
    }
    else {
      s = 1.0;
      temp1 = 0.0;
    }
    q[iVar3 * 2] = s;
    q[iVar3 * 2 + 1] = temp1;
    dVar5 = s * dVar5 + -(temp1 * dVar1);
    h[iVar3][iVar3] = dVar5;
    if ((dVar5 == 0.0) && (!NAN(dVar5))) {
      local_68 = n;
    }
  }
  return local_68;
}

Assistant:

int QRfact(int n, realtype **h, realtype *q, int job)
{
  realtype c, s, temp1, temp2, temp3;
  int i, j, k, q_ptr, n_minus_1, code=0;

  switch (job) {
  case 0:

    /* Compute a new factorization of H */

    code = 0;
    for (k=0; k < n; k++) {
      
      /* Multiply column k by the previous k-1 Givens rotations */

      for (j=0; j < k-1; j++) {
	i = 2*j;
	temp1 = h[j][k];
	temp2 = h[j+1][k];
	c = q[i];
	s = q[i+1];
	h[j][k] = c*temp1 - s*temp2;
	h[j+1][k] = s*temp1 + c*temp2;
      }
      
      /* Compute the Givens rotation components c and s */

      q_ptr = 2*k;
      temp1 = h[k][k];
      temp2 = h[k+1][k];
      if( temp2 == ZERO) {
	c = ONE;
	s = ZERO;
      } else if (SUNRabs(temp2) >= SUNRabs(temp1)) {
	temp3 = temp1/temp2;
	s = -ONE/SUNRsqrt(ONE+SUNSQR(temp3));
	c = -s*temp3;
      } else {
	temp3 = temp2/temp1;
	c = ONE/SUNRsqrt(ONE+SUNSQR(temp3));
	s = -c*temp3;
      }
      q[q_ptr] = c;
      q[q_ptr+1] = s;
      if( (h[k][k] = c*temp1 - s*temp2) == ZERO) code = k+1;
    }
    break;

  default:

    /* Update the factored H to which a new column has been added */

    n_minus_1 = n - 1;
    code = 0;
    
    /* Multiply the new column by the previous n-1 Givens rotations */

    for (k=0; k < n_minus_1; k++) {
      i = 2*k;
      temp1 = h[k][n_minus_1];
      temp2 = h[k+1][n_minus_1];
      c = q[i];
      s = q[i+1];
      h[k][n_minus_1] = c*temp1 - s*temp2;
      h[k+1][n_minus_1] = s*temp1 + c*temp2;
    }
    
    /* Compute new Givens rotation and multiply it times the last two
       entries in the new column of H.  Note that the second entry of 
       this product will be 0, so it is not necessary to compute it. */

    temp1 = h[n_minus_1][n_minus_1];
    temp2 = h[n][n_minus_1];
    if (temp2 == ZERO) {
      c = ONE;
      s = ZERO;
    } else if (SUNRabs(temp2) >= SUNRabs(temp1)) {
      temp3 = temp1/temp2;
      s = -ONE/SUNRsqrt(ONE+SUNSQR(temp3));
      c = -s*temp3;
    } else {
      temp3 = temp2/temp1;
      c = ONE/SUNRsqrt(ONE+SUNSQR(temp3));
      s = -c*temp3;
    }
    q_ptr = 2*n_minus_1;
    q[q_ptr] = c;
    q[q_ptr+1] = s;
    if ((h[n_minus_1][n_minus_1] = c*temp1 - s*temp2) == ZERO)
      code = n;
  }
  
  return (code);
}